

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<short,_sptk::int24_t>::Run
          (DataTransform<short,_sptk::int24_t> *this,istream *input_stream)

{
  byte bVar1;
  byte bVar2;
  NumericType NVar3;
  WarningType WVar4;
  char *__nptr;
  bool bVar5;
  int *piVar6;
  undefined8 uVar7;
  ostream *poVar8;
  size_t sVar9;
  uint uVar10;
  uint8_t uVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar19;
  short input_data;
  string word;
  char buffer [128];
  short local_274;
  int24_t local_272;
  int24_t local_26f;
  ushort local_26c;
  short local_26a;
  ulong local_268;
  istream *local_260;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_238 = &this->print_format_;
  local_268 = 0;
  local_260 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      local_228 = 0;
      local_220[0] = '\0';
      local_230 = local_220;
      std::operator>>(local_260,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar17 = 2;
        bVar5 = false;
      }
      else {
        piVar6 = __errno_location();
        iVar17 = *piVar6;
        *piVar6 = 0;
        strtold(__nptr,(char **)&local_258);
        if (local_258._M_dataplus._M_p == __nptr) {
          uVar7 = std::__throw_invalid_argument("stold");
LAB_001185dc:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar7);
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar17;
        }
        else if (*piVar6 == 0x22) {
          uVar7 = std::__throw_out_of_range("stold");
          goto LAB_001185dc;
        }
        local_26c = in_FPUControlWord | 0xc00;
        local_274 = (short)ROUND(in_ST0);
        iVar17 = 0;
        bVar5 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_26a = local_274;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar5) {
LAB_00118201:
        bVar1 = (this->minimum_value_).value[2];
        uVar14 = (uint)bVar1 * 0x10000;
        if ((char)bVar1 < '\0') {
          uVar15 = (*(ushort *)(this->minimum_value_).value + uVar14) - 0x1000000;
        }
        else {
          uVar15 = *(ushort *)(this->minimum_value_).value | uVar14;
        }
        bVar2 = (this->maximum_value_).value[2];
        uVar13 = (uint)bVar2 * 0x10000;
        if ((char)bVar2 < '\0') {
          uVar16 = (*(ushort *)(this->maximum_value_).value + uVar13) - 0x1000000;
        }
        else {
          uVar16 = *(ushort *)(this->maximum_value_).value | uVar13;
        }
        uVar10 = (uint)local_274;
        uVar11 = (uint8_t)((ushort)local_274 >> 8);
        bVar12 = (byte)(uVar10 >> 0xf);
        bVar5 = true;
        uVar18 = uVar10;
        if ((int)uVar15 < (int)uVar16) {
          NVar3 = this->input_numeric_type_;
          if (NVar3 == kFloatingPoint) {
LAB_00118284:
            if ((char)bVar1 < '\0') {
              uVar14 = (*(ushort *)(this->minimum_value_).value + uVar14) - 0x1000000;
            }
            else {
              uVar14 = *(ushort *)(this->minimum_value_).value | uVar14;
            }
            if ((int)uVar10 < (int)uVar14) {
LAB_001182df:
              uVar11 = (this->minimum_value_).value[1];
              bVar5 = false;
              uVar18 = (uint)(this->minimum_value_).value[0];
              bVar12 = bVar1;
            }
            else {
              if ((char)bVar2 < '\0') {
                uVar13 = (*(ushort *)(this->maximum_value_).value + uVar13) - 0x1000000;
              }
              else {
                uVar13 = *(ushort *)(this->maximum_value_).value | uVar13;
              }
              if ((int)uVar13 < (int)uVar10) goto LAB_00118315;
            }
          }
          else {
            if (NVar3 != kUnsignedInteger) {
              if (NVar3 != kSignedInteger) goto LAB_00118321;
              goto LAB_00118284;
            }
            if ((char)bVar1 < '\0') {
              uVar14 = (*(ushort *)(this->minimum_value_).value + uVar14) - 0x1000000;
            }
            else {
              uVar14 = *(ushort *)(this->minimum_value_).value | uVar14;
            }
            if (uVar10 < uVar14) goto LAB_001182df;
            if ((char)bVar2 < '\0') {
              uVar13 = (*(ushort *)(this->maximum_value_).value + uVar13) - 0x1000000;
            }
            else {
              uVar13 = *(ushort *)(this->maximum_value_).value | uVar13;
            }
            if (uVar10 <= uVar13) goto LAB_00118321;
LAB_00118315:
            uVar11 = (this->maximum_value_).value[1];
            bVar5 = false;
            uVar18 = (uint)(this->maximum_value_).value[0];
            bVar12 = bVar2;
          }
        }
LAB_00118321:
        if ((bVar5) && (this->rounding_ != false)) {
          if (local_274 < 1) {
            dVar19 = (double)(int)uVar10 + -0.5;
          }
          else {
            dVar19 = (double)(int)uVar10 + 0.5;
          }
          uVar18 = (uint)dVar19;
          uVar11 = (uint8_t)(uVar18 >> 8);
          bVar12 = (byte)(uVar18 >> 0x10);
        }
        if (!(bool)(bVar5 | this->warning_type_ == kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)local_268);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar17 = 1;
          if (WVar4 == kExit) goto LAB_00118500;
        }
        if (this->is_ascii_output_ == true) {
          local_26f.value[0] = (uint8_t)uVar18;
          local_26f.value[1] = uVar11;
          local_26f.value[2] = bVar12;
          bVar5 = sptk::SnPrintf<sptk::int24_t>(&local_26f,local_238,0x80,local_b8);
          iVar17 = 1;
          if (bVar5) {
            sVar9 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar9)
            ;
            if (((int)local_268 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_001184fd:
            iVar17 = 0;
          }
        }
        else {
          local_272.value[0] = (uint8_t)uVar18;
          local_272.value[1] = uVar11;
          local_272.value[2] = bVar12;
          bVar5 = sptk::WriteStream<sptk::int24_t>(&local_272,(ostream *)&std::cout);
          iVar17 = 1;
          if (bVar5) goto LAB_001184fd;
        }
      }
    }
    else {
      bVar5 = sptk::ReadStream<short>(&local_274,local_260);
      iVar17 = 2;
      if (bVar5) goto LAB_00118201;
    }
LAB_00118500:
    if (iVar17 != 0) {
      if (iVar17 == 2) {
        bVar5 = true;
        if ((this->is_ascii_output_ == true) &&
           ((int)((long)((ulong)(uint)((int)local_268 >> 0x1f) << 0x20 | local_268 & 0xffffffff) %
                 (long)this->num_column_) != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar5 = false;
      }
      return bVar5;
    }
    local_268 = (ulong)((int)local_268 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }